

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_refSlotAtPut
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t tuple;
  size_t slotIndex;
  ulong pointerLikeValue;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  pointerLikeValue = *arguments;
  if (pointerLikeValue == 0 || (pointerLikeValue & 0xf) != 0) {
    sysbvm_error_nullArgument();
    pointerLikeValue = *arguments;
  }
  tuple = sysbvm_pointerLikeType_load(context,pointerLikeValue);
  slotIndex = arguments[1] >> 4;
  if ((arguments[1] & 0xf) == 0) {
    slotIndex = 0;
  }
  sysbvm_tuple_slotAtPut(context,tuple,slotIndex,arguments[2]);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_refSlotAtPut(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);
    if(!sysbvm_tuple_isNonNullPointer(arguments[0])) sysbvm_error_nullArgument();

    sysbvm_tuple_slotAtPut(context, sysbvm_pointerLikeType_load(context, arguments[0]), sysbvm_tuple_anySize_decode(arguments[1]), arguments[2]);
    return SYSBVM_VOID_TUPLE;
}